

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow **ppIVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  pIVar2 = GImGui;
  if (window->RootWindow != window) {
    __assert_fail("window == window->RootWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1b4e,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
  }
  uVar5 = (uint)window->FocusOrder;
  if (-1 < window->FocusOrder) {
    uVar1 = (GImGui->WindowsFocusOrder).Size;
    if ((int)uVar5 < (int)uVar1) {
      ppIVar3 = (GImGui->WindowsFocusOrder).Data;
      if (ppIVar3[uVar5] != window) {
        __assert_fail("g.WindowsFocusOrder[cur_order] == window",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1b51,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
      }
      if (ppIVar3[(ulong)uVar1 - 1] != window) {
        uVar7 = uVar1 - 1;
        uVar6 = (ulong)uVar5 - 1;
        uVar8 = uVar1;
        while ((int)uVar5 < (int)uVar7) {
          if (((int)uVar8 <= (int)(uVar5 + 1)) ||
             (ppIVar3[uVar6 + 1] = ppIVar3[uVar6 + 2],
             (pIVar2->WindowsFocusOrder).Size <= (int)uVar5)) goto LAB_001372a4;
          ppIVar3 = (pIVar2->WindowsFocusOrder).Data;
          sVar4 = (short)*(undefined4 *)&ppIVar3[uVar6 + 1]->FocusOrder + -1;
          ppIVar3[uVar6 + 1]->FocusOrder = sVar4;
          uVar8 = (pIVar2->WindowsFocusOrder).Size;
          if ((int)uVar8 <= (int)uVar5) goto LAB_001372a4;
          uVar6 = uVar6 + 1;
          uVar5 = uVar5 + 1;
          if (uVar6 != ((long)sVar4 & 0xffffffffU)) {
            __assert_fail("g.WindowsFocusOrder[n]->FocusOrder == n",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x1b5a,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
          }
        }
        if ((int)uVar8 < (int)uVar1) goto LAB_001372a4;
        ppIVar3[uVar7] = window;
        window->FocusOrder = (short)uVar7;
      }
      return;
    }
  }
LAB_001372a4:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}